

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::BufferStorage::ErrorsTest::iterate(ErrorsTest *this)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar5;
  bool test_result;
  string message;
  bool local_81;
  Buffer local_80;
  string local_60;
  code *local_40;
  undefined4 local_38;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_81 = true;
  BufferStorage::Buffer::LoadExtDirectStateAccess((this->super_TestCase).m_context);
  if (m_direct_state_access_support == 0) {
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    description = "Unsupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    lVar5 = 0;
    do {
      uVar1 = *(undefined4 *)((long)&BufferStorage::Buffer::m_targets + lVar5);
      local_80._0_8_ = (GLchar *)((long)&local_80 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"BufferStorage was executed for id 0, target: ","");
      local_40 = glu::getBufferTargetName;
      local_38 = uVar1;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
      std::__cxx11::string::append((char *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      (**(code **)(lVar4 + 0x40))(uVar1,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"BindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                      ,0x284);
      (**(code **)(lVar4 + 0x160))(uVar1,0,0,0x100);
      verifyError(this,0x502,(GLchar *)local_80._0_8_,&local_81);
      if ((GLchar *)local_80._0_8_ != (GLchar *)((long)&local_80 + 0x10U)) {
        operator_delete((void *)local_80._0_8_,CONCAT44(local_80._20_4_,local_80.m_target) + 1);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x34);
    local_80.m_context = (this->super_TestCase).m_context;
    local_80.m_id = 0xffffffff;
    local_80.m_target = 0x8892;
    BufferStorage::Buffer::InitStorage(&local_80,0x8892,0x100,0x20,iterate::data);
    if (*(code **)(lVar4 + 0xed8) != (code *)0x0) {
      (**(code **)(lVar4 + 0xed8))(local_80._0_8_ & 0xffffffff,0x20,iterate::data,0x100);
      verifyError(this,0x502,"NamedBufferStorage was executed for id with immutable storage",
                  &local_81);
    }
    (**(code **)(lVar4 + 0x40))(0x8892,local_80._0_8_ & 0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    (**(code **)(lVar4 + 0x160))(0x8892,0x20,iterate::data,0x100);
    verifyError(this,0x502,"BufferStorage was executed for target with immutable storage",&local_81)
    ;
    (**(code **)(lVar4 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    BufferStorage::Buffer::~Buffer(&local_80);
    local_80.m_context = (this->super_TestCase).m_context;
    local_80.m_id = 0xffffffff;
    local_80.m_target = 0x8892;
    (**(code **)(lVar4 + 0x3b8))(1,&local_80);
    if (*(code **)(lVar4 + 0xed8) != (code *)0x0) {
      (**(code **)(lVar4 + 0xed8))(local_80._0_8_ & 0xffffffff,0,iterate()::data,0x100);
      verifyError(this,0x501,"NamedBufferStorage was executed with size == 0",&local_81);
      (**(code **)(lVar4 + 0xed8))
                (local_80._0_8_ & 0xffffffff,0xfffffffffffffff0,iterate()::data,0x100);
      verifyError(this,0x501,"NamedBufferStorage was executed with size == -16",&local_81);
    }
    (**(code **)(lVar4 + 0x40))(0x8892,local_80._0_8_ & 0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    (**(code **)(lVar4 + 0x160))(0x8892,0,iterate()::data,0x100);
    verifyError(this,0x501,"BufferStorage was executed with size == 0",&local_81);
    (**(code **)(lVar4 + 0x160))(0x8892,0xfffffffffffffff0,iterate()::data,0x100);
    verifyError(this,0x501,"BufferStorage was executed with size == -16",&local_81);
    (**(code **)(lVar4 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    BufferStorage::Buffer::~Buffer(&local_80);
    local_80.m_context = (this->super_TestCase).m_context;
    local_80.m_id = 0xffffffff;
    local_80.m_target = 0x8892;
    (**(code **)(lVar4 + 0x3b8))(1,&local_80);
    if (*(code **)(lVar4 + 0xed8) != (code *)0x0) {
      (**(code **)(lVar4 + 0xed8))(local_80._0_8_ & 0xffffffff,0x20,iterate()::data,0x40);
      verifyError(this,0x501,"NamedBufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
                  &local_81);
    }
    (**(code **)(lVar4 + 0x40))(0x8892,local_80._0_8_ & 0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    (**(code **)(lVar4 + 0x160))(0x8892,0x20,iterate()::data,0x40);
    verifyError(this,0x501,"BufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
                &local_81);
    (**(code **)(lVar4 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    BufferStorage::Buffer::~Buffer(&local_80);
    local_80.m_context = (this->super_TestCase).m_context;
    local_80.m_id = 0xffffffff;
    local_80.m_target = 0x8892;
    (**(code **)(lVar4 + 0x3b8))(1,&local_80);
    if (*(code **)(lVar4 + 0xed8) != (code *)0x0) {
      (**(code **)(lVar4 + 0xed8))(local_80._0_8_ & 0xffffffff,0x20,iterate()::data,0x80);
      verifyError(this,0x501,"NamedBufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
                  &local_81);
    }
    (**(code **)(lVar4 + 0x40))(0x8892,local_80._0_8_ & 0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    (**(code **)(lVar4 + 0x160))(0x8892,0x20,iterate()::data,0x80);
    verifyError(this,0x501,"BufferStorage was executed with flags == GL_MAP_COHERENT_BIT",&local_81)
    ;
    (**(code **)(lVar4 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    BufferStorage::Buffer::~Buffer(&local_80);
    local_80.m_context = (this->super_TestCase).m_context;
    local_80.m_id = 0xffffffff;
    local_80.m_target = 0x8892;
    BufferStorage::Buffer::InitStorage(&local_80,0x8892,0x100,0x20,iterate()::data);
    if (*(code **)(lVar4 + 0xd10) != (code *)0x0) {
      (**(code **)(lVar4 + 0xd10))(local_80._0_8_ & 0xffffffff,0,0x20,1);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&local_81);
      (**(code **)(lVar4 + 0xd10))(local_80._0_8_ & 0xffffffff,0,0x20,2);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&local_81);
      (**(code **)(lVar4 + 0xd10))(local_80._0_8_ & 0xffffffff,0,0x20,0x40);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&local_81);
      (**(code **)(lVar4 + 0xd10))(local_80._0_8_ & 0xffffffff,0,0x20,0x80);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&local_81);
    }
    (**(code **)(lVar4 + 0x40))(0x8892,local_80._0_8_ & 0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    (**(code **)(lVar4 + 0xd00))(0x8892,0,0x20,1);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&local_81);
    (**(code **)(lVar4 + 0xd00))(0x8892,0,0x20,2);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&local_81);
    (**(code **)(lVar4 + 0xd00))(0x8892,0,0x20,0x40);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&local_81);
    (**(code **)(lVar4 + 0xd00))(0x8892,0,0x20,0x80);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&local_81);
    (**(code **)(lVar4 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    BufferStorage::Buffer::~Buffer(&local_80);
    local_80.m_context = (this->super_TestCase).m_context;
    local_80.m_id = 0xffffffff;
    local_80.m_target = 0x8892;
    BufferStorage::Buffer::InitStorage(&local_80,0x8892,0x43,0x20,iterate()::data);
    if (*(code **)(lVar4 + 0xee0) != (code *)0x0) {
      (**(code **)(lVar4 + 0xee0))(local_80._0_8_ & 0xffffffff,0,0x20,iterate()::data);
      verifyError(this,0x502,
                  "NamedBufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
                  &local_81);
    }
    (**(code **)(lVar4 + 0x40))(0x8892,local_80._0_8_ & 0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    (**(code **)(lVar4 + 0x168))(0x8892,0,0x20,iterate()::data);
    verifyError(this,0x502,"BufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
                &local_81);
    (**(code **)(lVar4 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                    ,0x284);
    BufferStorage::Buffer::~Buffer(&local_80);
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    if (local_81 == true) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	Buffer::LoadExtDirectStateAccess(m_context);

	// No GL45 or GL_ARB_direct_state_access support
	if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NONE)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported");
		return tcu::TestNode::STOP;
	}

	/*
	 * - INVALID_OPERATION is generated by BufferStorage when 0 is bound to
	 * <target>; Check all targets;
	 */
	for (GLuint i = 0; i < Buffer::m_n_targets; ++i)
	{
		const GLenum target  = Buffer::m_targets[i];
		std::string  message = "BufferStorage was executed for id 0, target: ";

		message.append(glu::getBufferTargetStr(target).toString().c_str());

		Buffer::Bind(gl, 0 /* id */, target);
		gl.bufferStorage(target, 0 /* size */, 0 /* data */, GL_DYNAMIC_STORAGE_BIT /* flags */);

		verifyError(GL_INVALID_OPERATION, message.c_str(), test_result);
	}

	/*
	 * - INVLIAD_OPERATION is generated by BufferStorage, NamedBufferStorage and
	 * BufferData if buffer already have immutable store;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, data);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_OPERATION, "NamedBufferStorage was executed for id with immutable storage",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_OPERATION, "BufferStorage was executed for target with immutable storage", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <size> is less or equal to zero;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, 0 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with size == 0", test_result);

			gl.namedBufferStorage(buffer.m_id, -16 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with size == -16", test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, 0 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with size == 0", test_result);

		gl.bufferStorage(GL_ARRAY_BUFFER, -16 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with size == -16", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVLAID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <flags> contains MAP_PERSISTENT_BIT and neither MAP_READ_BIT nor
	 * MAP_WRITE_BIT;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_MAP_PERSISTENT_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_MAP_PERSISTENT_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <flags> contains MAP_COHERENT_BIT and no MAP_PERSISTENT_BIT;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_MAP_COHERENT_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_MAP_COHERENT_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with flags == GL_MAP_COHERENT_BIT", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_OPERATION is generated by MapBufferRange if any of:
	 *   * MAP_COHERENT_BIT,
	 *   * MAP_PERSISTENT_BIT,
	 *   * MAP_READ_BIT,
	 *   * MAP_WRITE_BIT
	 * is included in <access> and not in buffer's storage flags;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, data);

		/* MapNamedBufferRange */
		if (0 != gl.mapNamedBufferRange)
		{
			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_READ_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_READ_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_WRITE_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_WRITE_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_COHERENT_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_COHERENT_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_READ_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_WRITE_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_COHERENT_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_OPERATION is generated by BufferSubData and NamedBufferSubData
	 * when buffer has immutable store but its flags does not include
	 * DYNAMIC_STORAGE.
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT, data_size,
						   data);

		/* NamedBufferSubData */
		if (0 != gl.namedBufferSubData)
		{
			gl.namedBufferSubData(buffer.m_id, 0 /* offset */, data_size, data);
			verifyError(GL_INVALID_OPERATION,
						"NamedBufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT", test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferSubData(GL_ARRAY_BUFFER, 0 /* offset */, data_size, data);
		verifyError(GL_INVALID_OPERATION, "BufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
					test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}